

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O2

FormatDescriptor *
ktx::createFormatDescriptor
          (FormatDescriptor *__return_storage_ptr__,VkFormat vkFormat,Reporter *report)

{
  uint32_t *dfd;
  undefined1 auVar1 [12];
  string sStack_48;
  
  auVar1 = vk2dfd(vkFormat);
  dfd = auVar1._0_8_;
  if (dfd == (uint32_t *)0x0) {
    toString_abi_cxx11_(&sStack_48,(ktx *)(ulong)vkFormat,auVar1._8_4_);
    Reporter::fatal<char_const(&)[43],std::__cxx11::string>
              (report,DFD_FAILURE,(char (*) [43])"Failed to create format descriptor for: {}",
               &sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  createFormatDescriptor(__return_storage_ptr__,dfd);
  free(dfd);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(VkFormat vkFormat, Reporter& report) {
    const auto dfd = std::unique_ptr<uint32_t[], decltype(std::free)*>(vk2dfd(vkFormat), std::free);
    if (!dfd)
        report.fatal(rc::DFD_FAILURE, "Failed to create format descriptor for: {}", toString(vkFormat));

    return createFormatDescriptor(dfd.get());
}